

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  bool bVar9;
  float fVar10;
  
  uVar5 = *X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0.0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  if (length < 2) {
    uVar7 = 1;
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    uVar7 = 1;
    do {
      uVar2 = X[uVar7];
      if (uVar2 != uVar5) {
        uVar4 = (uint32_t)uVar7;
        iVar6 = uVar4 - uVar8;
        if (uVar5 != 0) {
          bit_entropy->sum = bit_entropy->sum + iVar6 * uVar5;
          bit_entropy->nonzeros = (bit_entropy->nonzeros + uVar4) - uVar8;
          bit_entropy->nonzero_code = uVar8;
          if (uVar5 < 0x100) {
            fVar10 = kSLog2Table[uVar5];
          }
          else {
            fVar10 = (*VP8LFastSLog2Slow)(uVar5);
          }
          bit_entropy->entropy = bit_entropy->entropy - (double)((float)iVar6 * fVar10);
          if (bit_entropy->max_val < uVar5) {
            bit_entropy->max_val = uVar5;
          }
        }
        bVar3 = 3 < iVar6;
        bVar9 = uVar5 != 0;
        stats->counts[bVar9] = stats->counts[bVar9] + (uint)bVar3;
        stats->streaks[bVar9][bVar3] = (stats->streaks[bVar9][bVar3] - uVar8) + uVar4;
        uVar5 = uVar2;
        uVar8 = uVar4;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)length != uVar7);
  }
  iVar6 = (int)uVar7 - uVar8;
  if (uVar5 != 0) {
    bit_entropy->sum = bit_entropy->sum + iVar6 * uVar5;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar6;
    bit_entropy->nonzero_code = uVar8;
    if (uVar5 < 0x100) {
      fVar10 = kSLog2Table[uVar5];
    }
    else {
      fVar10 = (*VP8LFastSLog2Slow)(uVar5);
    }
    bit_entropy->entropy = bit_entropy->entropy - (double)((float)iVar6 * fVar10);
    if (bit_entropy->max_val < uVar5) {
      bit_entropy->max_val = uVar5;
    }
  }
  stats->counts[uVar5 != 0] = stats->counts[uVar5 != 0] + (uint)(3 < iVar6);
  piVar1 = stats->streaks[uVar5 != 0] + (3 < iVar6);
  *piVar1 = *piVar1 + iVar6;
  uVar5 = bit_entropy->sum;
  if ((ulong)uVar5 < 0x100) {
    fVar10 = kSLog2Table[uVar5];
  }
  else {
    fVar10 = (*VP8LFastSLog2Slow)(uVar5);
  }
  bit_entropy->entropy = (double)fVar10 + bit_entropy->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(const uint32_t X[], int length,
                                  VP8LBitEntropy* const bit_entropy,
                                  VP8LStreaks* const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}